

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  string *psVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  string normalizedComment;
  string local_60;
  string local_40;
  
  bVar2 = Value::hasComment(root,commentBefore);
  if (bVar2) {
    psVar1 = &this->document_;
    std::__cxx11::string::append((char *)psVar1);
    writeIndent(this);
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    normalizeEOL(&local_60,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    _Var3._M_p = local_60._M_dataplus._M_p;
    if (local_60._M_string_length != 0) {
      do {
        std::__cxx11::string::push_back((char)psVar1);
        if ((*_Var3._M_p == '\n') && (_Var3._M_p[1] == '/')) {
          writeIndent(this);
        }
        _Var3._M_p = _Var3._M_p + 1;
      } while (_Var3._M_p != local_60._M_dataplus._M_p + local_60._M_string_length);
    }
    std::__cxx11::string::append((char *)psVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += "\n";
  writeIndent();
  std::string normalizedComment = normalizeEOL(root.getComment(commentBefore));
  std::string::const_iterator iter = normalizedComment.begin();
  while (iter != normalizedComment.end()) {
    document_ += *iter;
    if (*iter == '\n' && *(iter + 1) == '/')
      writeIndent();
    ++iter;
  }

  // Comments are stripped of newlines, so add one here
  document_ += "\n";
}